

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metrics.cpp
# Opt level: O2

void __thiscall wasm::Metrics::Metrics(Metrics *this,bool byFunction)

{
  _Rb_tree_header *p_Var1;
  
  WalkerPass<wasm::PostWalker<wasm::Metrics,_wasm::UnifiedExpressionVisitor<wasm::Metrics,_void>_>_>
  ::WalkerPass(&this->
                super_WalkerPass<wasm::PostWalker<wasm::Metrics,_wasm::UnifiedExpressionVisitor<wasm::Metrics,_void>_>_>
              );
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::Metrics,_wasm::UnifiedExpressionVisitor<wasm::Metrics,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__Metrics_01122b68;
  this->byFunction = byFunction;
  p_Var1 = &(this->counts)._M_t._M_impl.super__Rb_tree_header;
  (this->counts)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->counts)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->counts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->counts)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->counts)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

Metrics(bool byFunction) : byFunction(byFunction) {}